

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O1

void Mvc_CoverDivideInternal
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int *piVar1;
  int iVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pCover_01;
  undefined4 *__ptr;
  Mvc_Cube_t *pMVar10;
  Mvc_Cube_t **ppMVar11;
  long lVar12;
  Mvc_Cube_t **ppMVar13;
  Mvc_Cube_t *pMVar14;
  Mvc_List_t *pList;
  Mvc_List_t *pMVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  bool bVar24;
  Mvc_List_t *pList_3;
  int local_dc;
  ulong local_68;
  
  uVar4 = Mvc_CoverReadCubeNum(pDiv);
  uVar5 = Mvc_CoverReadCubeNum(pCover);
  if (uVar4 == 1) {
    iVar6 = Mvc_CoverIsOneLiteral(pDiv);
    if (iVar6 == 0) {
      Mvc_CoverDivideByCube(pCover,pDiv,ppQuo,ppRem);
      return;
    }
    Mvc_CoverDivideByLiteral(pCover,pDiv,ppQuo,ppRem);
    return;
  }
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pCover_01 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  Mvc_CoverAllocateMask(pDiv);
  Mvc_CoverSupport(pDiv,pDiv->pMask);
  uVar8 = 0;
  Mvc_CoverSort(pDiv,(Mvc_Cube_t *)0x0,Mvc_CubeCompareInt);
  Mvc_CoverSort(pCover,pDiv->pMask,Mvc_CubeCompareIntOutsideAndUnderMask);
  __ptr = (undefined4 *)malloc((long)(int)uVar5 * 4 + 4);
  Mvc_CoverList2Array(pCover);
  Mvc_CoverList2Array(pDiv);
  *__ptr = 0;
  uVar7 = 1;
  if (1 < (int)uVar5) {
    ppMVar13 = pCover->pCubes;
    uVar17 = 1;
    do {
      pMVar14 = ppMVar13[uVar17 - 1];
      pMVar10 = ppMVar13[uVar17];
      uVar21 = *(uint *)&pMVar14->field_0x8 & 0xffffff;
      if (uVar21 == 0) {
        uVar21 = pDiv->pMask->pData[0];
        uVar19 = pMVar14->pData[0] | uVar21;
        uVar21 = uVar21 | pMVar10->pData[0];
LAB_0040ad97:
        if (uVar19 != uVar21) {
LAB_0040ada3:
          lVar18 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          __ptr[lVar18] = (int)uVar17;
        }
      }
      else {
        if (uVar21 == 1) {
          uVar21 = pDiv->pMask->pData[0];
          if ((pMVar14->pData[0] | uVar21) == (uVar21 | pMVar10->pData[0])) {
            uVar21 = *(uint *)&pDiv->pMask->field_0x14;
            uVar19 = *(uint *)&pMVar14->field_0x14 | uVar21;
            uVar21 = uVar21 | *(uint *)&pMVar10->field_0x14;
            goto LAB_0040ad97;
          }
          goto LAB_0040ada3;
        }
        do {
          uVar19 = pDiv->pMask->pData[uVar21];
          if ((pMVar14->pData[uVar21] | uVar19) != (uVar19 | pMVar10->pData[uVar21]))
          goto LAB_0040ada3;
          bVar24 = 0 < (int)uVar21;
          uVar21 = uVar21 - 1;
        } while (bVar24);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar5);
  }
  __ptr[(int)uVar7] = uVar5;
  if ((int)uVar7 < 1) {
LAB_0040b274:
    if (uVar8 != uVar5) {
      __assert_fail("nCubes == nCubesC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                    ,0xf6,
                    "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                   );
    }
    free(__ptr);
    *ppRem = pCover_01;
    *ppQuo = pCover_00;
    return;
  }
  pMVar15 = &pCover_01->lCubes;
  uVar21 = 1;
  if (1 < (int)uVar4) {
    uVar21 = uVar4;
  }
  local_dc = -1;
  uVar17 = 0;
  uVar8 = 0;
LAB_0040ae6c:
  iVar6 = __ptr[uVar17 + 1];
  iVar2 = __ptr[uVar17];
  lVar18 = (long)iVar2;
  iVar23 = iVar6 - iVar2;
  if ((int)uVar4 <= iVar23) {
    if (iVar2 < iVar6) {
      ppMVar13 = pCover->pCubes;
      lVar12 = lVar18;
      do {
        ppMVar13[lVar12]->nOnes = 1;
        lVar12 = lVar12 + 1;
      } while (iVar6 != lVar12);
    }
    ppMVar13 = pDiv->pCubes;
    ppMVar11 = pCover->pCubes + lVar18;
    iVar16 = 0;
    lVar12 = 1;
    local_68 = 1;
    do {
      pMVar14 = *ppMVar13;
      iVar20 = (int)lVar12;
      lVar22 = 0;
      lVar12 = lVar18 * 8 + (long)iVar20 * 8;
      while( true ) {
        pMVar10 = *ppMVar11;
        iVar9 = Mvc_CubeCompareIntUnderMask(pMVar10,pMVar14,pDiv->pMask);
        uVar19 = (uint)lVar22;
        if (iVar9 != -1) break;
        if ((int)(((iVar6 - iVar2) - iVar20) + uVar19) < (int)(uVar4 - iVar16)) goto LAB_0040b0ab;
        lVar22 = lVar22 + -1;
        ppMVar11 = (Mvc_Cube_t **)(lVar12 + (long)pCover->pCubes);
        lVar12 = lVar12 + 8;
      }
      if (iVar9 == 1) {
LAB_0040b0ab:
        bVar24 = false;
        goto LAB_0040b0ba;
      }
      pMVar10->nOnes = 0;
      if (local_68 == uVar4) goto LAB_0040b258;
      if (iVar16 == uVar21 - 1) {
        __assert_fail("iCubeD < nCubesD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                      ,0xcf,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      iVar9 = (iVar20 + iVar2) - uVar19;
      if ((int)uVar5 <= iVar9) {
        __assert_fail("pGroups[g]+iCubeC < nCubesC",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                      ,0xd3,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      local_dc = (iVar20 + -1) - uVar19;
      iVar16 = iVar16 + 1;
      ppMVar13 = pDiv->pCubes + local_68;
      local_68 = local_68 + 1;
      lVar12 = (iVar20 - lVar22) + 1;
      ppMVar11 = pCover->pCubes + iVar9;
    } while( true );
  }
  if (iVar2 < iVar6) {
    do {
      pMVar10 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar18]);
      pMVar14 = (Mvc_Cube_t *)pMVar15;
      if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar14 = (pCover_01->lCubes).pTail;
      }
      pMVar14->pNext = pMVar10;
      (pCover_01->lCubes).pTail = pMVar10;
      pMVar10->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover_01->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      lVar18 = lVar18 + 1;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    uVar8 = (uVar8 + iVar6) - iVar2;
  }
  goto LAB_0040b245;
LAB_0040b258:
  local_dc = ~uVar19 + iVar20;
  bVar24 = true;
LAB_0040b0ba:
  if (bVar24) {
    if (iVar2 < iVar6) {
      do {
        if (pCover->pCubes[lVar18]->nOnes != 0) {
          pMVar10 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar18]);
          pMVar14 = (Mvc_Cube_t *)pMVar15;
          if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
            pMVar14 = (pCover_01->lCubes).pTail;
          }
          pMVar14->pNext = pMVar10;
          (pCover_01->lCubes).pTail = pMVar10;
          pMVar10->pNext = (Mvc_Cube_t *)0x0;
          piVar1 = &(pCover_01->lCubes).nItems;
          *piVar1 = *piVar1 + 1;
          uVar8 = uVar8 + 1;
        }
        lVar18 = lVar18 + 1;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
    }
    pMVar10 = Mvc_CubeAlloc(pCover_00);
    pMVar14 = pCover->pCubes[iVar2 + local_dc];
    uVar19 = *(uint *)&pMVar14->field_0x8 & 0xffffff;
    if (uVar19 == 0) {
      pMVar10->pData[0] = ~pDiv->pMask->pData[0] & pMVar14->pData[0];
    }
    else if (uVar19 == 1) {
      pMVar3 = pDiv->pMask;
      pMVar10->pData[0] = ~pMVar3->pData[0] & pMVar14->pData[0];
      *(uint *)&pMVar10->field_0x14 = ~*(uint *)&pMVar3->field_0x14 & *(uint *)&pMVar14->field_0x14;
    }
    else {
      pMVar3 = pDiv->pMask;
      lVar18 = (ulong)(*(uint *)&pMVar14->field_0x8 & 0xffffff) + 4;
      do {
        pMVar10->pData[lVar18 + -4] = ~pMVar3->pData[lVar18 + -4] & pMVar14->pData[lVar18 + -4];
        lVar12 = lVar18 + -4;
        bVar24 = lVar18 != 4;
        lVar18 = lVar18 + -1;
      } while (bVar24 && -1 < lVar12);
    }
    pMVar14 = (Mvc_Cube_t *)&pCover_00->lCubes;
    if ((pCover_00->lCubes).pHead != (Mvc_Cube_t *)0x0) {
      pMVar14 = (pCover_00->lCubes).pTail;
    }
    pMVar14->pNext = pMVar10;
    (pCover_00->lCubes).pTail = pMVar10;
    pMVar10->pNext = (Mvc_Cube_t *)0x0;
    piVar1 = &(pCover_00->lCubes).nItems;
    *piVar1 = *piVar1 + 1;
    uVar8 = uVar8 + uVar4;
  }
  else if (iVar2 < iVar6) {
    do {
      pMVar10 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar18]);
      pMVar14 = (Mvc_Cube_t *)pMVar15;
      if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar14 = (pCover_01->lCubes).pTail;
      }
      pMVar14->pNext = pMVar10;
      (pCover_01->lCubes).pTail = pMVar10;
      pMVar10->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover_01->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      lVar18 = lVar18 + 1;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    uVar8 = (uVar8 + iVar6) - iVar2;
  }
LAB_0040b245:
  uVar17 = uVar17 + 1;
  if (uVar17 == uVar7) goto LAB_0040b274;
  goto LAB_0040ae6c;
}

Assistant:

void Mvc_CoverDivideInternal( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeD, * pCubeCopy;
    Mvc_Cube_t * pCube1, * pCube2;
    int * pGroups, nGroups;    // the cube groups
    int nCubesC, nCubesD, nMerges, iCubeC, iCubeD;
    int iMerge = -1; // Suppress "might be used uninitialized"
    int fSkipG, GroupSize, g, c, RetValue;
    int nCubes;

    // get cover sizes
    nCubesD = Mvc_CoverReadCubeNum( pDiv );
    nCubesC = Mvc_CoverReadCubeNum( pCover );

    // check trivial cases
    if ( nCubesD == 1 )
    {
        if ( Mvc_CoverIsOneLiteral( pDiv ) )
            Mvc_CoverDivideByLiteral( pCover, pDiv, ppQuo, ppRem );
        else
            Mvc_CoverDivideByCube( pCover, pDiv, ppQuo, ppRem );
        return;
    }

    // create the divisor and the remainder 
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the support of the divisor
    Mvc_CoverAllocateMask( pDiv );
    Mvc_CoverSupport( pDiv, pDiv->pMask );

    // sort the cubes of the divisor
    Mvc_CoverSort( pDiv, NULL, Mvc_CubeCompareInt );
    // sort the cubes of the cover
    Mvc_CoverSort( pCover, pDiv->pMask, Mvc_CubeCompareIntOutsideAndUnderMask );

    // allocate storage for cube groups
    pGroups = MEM_ALLOC( pCover->pMem, int, nCubesC + 1 );

    // mask contains variables in the support of Div
    // split the cubes into groups using the mask
    Mvc_CoverList2Array( pCover );
    Mvc_CoverList2Array( pDiv );
    pGroups[0] = 0;
    nGroups    = 1;
    for ( c = 1; c < nCubesC; c++ )
    {
        // get the cubes
        pCube1 = pCover->pCubes[c-1];
        pCube2 = pCover->pCubes[c  ];
        // compare the cubes
        Mvc_CubeBitEqualOutsideMask( RetValue, pCube1, pCube2, pDiv->pMask );
        if ( !RetValue )
            pGroups[nGroups++] = c;
    }
    // finish off the last group
    pGroups[nGroups] = nCubesC;

    // consider each group separately and decide
    // whether it can produce a quotient cube
    nCubes = 0;
    for ( g = 0; g < nGroups; g++ )
    {
        // if the group has less than nCubesD cubes, 
        // there is no way it can produce the quotient cube
        // copy the cubes to the remainder
        GroupSize = pGroups[g+1] - pGroups[g];
        if ( GroupSize < nCubesD )
        {
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // mark the cubes as those that should be added to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            Mvc_CubeSetSize( pCover->pCubes[c], 1 );

        // go through the cubes in the group and at the same time
        // go through the cubes in the divisor
        iCubeD  = 0;
        iCubeC  = 0;
        pCubeD  = pDiv->pCubes[iCubeD++];
        pCubeC  = pCover->pCubes[pGroups[g]+iCubeC++];
        fSkipG  = 0;
        nMerges = 0;

        while ( 1 )
        {
            // compare the topmost cubes in F and in D
            RetValue = Mvc_CubeCompareIntUnderMask( pCubeC, pCubeD, pDiv->pMask );
            // cube are ordered in increasing order of their int value
            if ( RetValue == -1 ) // pCubeC is above pCubeD
            {  // cube in C should be added to the remainder
                // check that there is enough cubes in the group
                if ( GroupSize - iCubeC < nCubesD - nMerges )
                {
                    fSkipG = 1;
                    break;
                }
                // get the next cube in the cover
                pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
                continue;
            }
            if ( RetValue == 1 ) // pCubeD is above pCubeC
            { // given cube in D does not have a corresponding cube in the cover
                fSkipG = 1;
                break;
            }
            // mark the cube as the one that should NOT be added to the remainder
            Mvc_CubeSetSize( pCubeC, 0 );
            // remember this merged cube
            iMerge = iCubeC-1;
            nMerges++;

            // stop if we considered the last cube of the group
            if ( iCubeD == nCubesD )
                break;

            // advance the cube of the divisor
            assert( iCubeD < nCubesD );
            pCubeD = pDiv->pCubes[iCubeD++];

            // advance the cube of the group
            assert( pGroups[g]+iCubeC < nCubesC );
            pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
        }

        if ( fSkipG )
        { 
            // the group has failed, add all the cubes to the remainder
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // the group has worked, add left-over cubes to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
        {
            pCubeC = pCover->pCubes[c];
            if ( Mvc_CubeReadSize(pCubeC) )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCubeC );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
        }

        // create the quotient cube
        pCube1 = Mvc_CubeAlloc( pQuo );
        Mvc_CubeBitSharp( pCube1, pCover->pCubes[pGroups[g]+iMerge], pDiv->pMask );
        // add the cube to the quotient
        Mvc_CoverAddCubeTail( pQuo, pCube1 );
        nCubes += nCubesD;
    }
    assert( nCubes == nCubesC );

    // deallocate the memory
    MEM_FREE( pCover->pMem, int, nCubesC + 1, pGroups );

    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
//    Mvc_CoverVerifyDivision( pCover, pDiv, pQuo, pRem );
}